

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

Kit_DsdObj_t * Kit_DsdNonDsdPrimeMax(Kit_DsdNtk_t *pNtk)

{
  bool bVar1;
  uint local_28;
  uint local_24;
  uint nSizeMax;
  uint i;
  Kit_DsdObj_t *pObjMax;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk_local;
  
  _nSizeMax = (Kit_DsdObj_t *)0x0;
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < pNtk->nNodes) {
      pObjMax = pNtk->pNodes[local_24];
      bVar1 = pObjMax != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar1) break;
    if ((((uint)*pObjMax >> 6 & 7) == 5) && (local_28 < (uint)*pObjMax >> 0x1a)) {
      local_28 = (uint)*pObjMax >> 0x1a;
      _nSizeMax = pObjMax;
    }
    local_24 = local_24 + 1;
  }
  return _nSizeMax;
}

Assistant:

Kit_DsdObj_t * Kit_DsdNonDsdPrimeMax( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj, * pObjMax = NULL;
    unsigned i, nSizeMax = 0;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        if ( nSizeMax < pObj->nFans )
        {
            nSizeMax = pObj->nFans;
            pObjMax = pObj;
        }
    }
    return pObjMax;
}